

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_environment_evaluateSymbolBinding
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  sysbvm_tuple_t context_00;
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_size_t sVar4;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t foundBinding;
  sysbvm_tuple_t bindingType;
  size_t vectorIndex;
  sysbvm_symbolAnalysisBinding_t *analysisBinding;
  sysbvm_functionActivationEnvironment_t *activationEnvironment;
  sysbvm_tuple_t binding_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  activationEnvironment = (sysbvm_functionActivationEnvironment_t *)binding;
  binding_local = environment;
  environment_local = (sysbvm_tuple_t)context;
  sVar2 = sysbvm_tuple_getType(context,environment);
  context_00 = environment_local;
  sVar3 = binding_local;
  if (sVar2 == *(sysbvm_tuple_t *)(environment_local + 0x408)) {
    analysisBinding = (sysbvm_symbolAnalysisBinding_t *)binding_local;
    vectorIndex = (size_t)activationEnvironment;
    if (((activationEnvironment->super).super.analysisQueue ==
         *(sysbvm_tuple_t *)(binding_local + 0x80)) || (*(long *)(binding_local + 0x88) != 0)) {
      bindingType = sysbvm_tuple_size_decode((activationEnvironment->super).super.symbolTable);
      foundBinding = sysbvm_tuple_getType
                               ((sysbvm_context_t *)environment_local,
                                (sysbvm_tuple_t)activationEnvironment);
      if (foundBinding == *(sysbvm_tuple_t *)(environment_local + 0x628)) {
        sVar3 = sysbvm_array_at(analysisBinding[2].super.super.name,bindingType);
        return sVar3;
      }
      if (foundBinding == *(sysbvm_tuple_t *)(environment_local + 0x640)) {
        sVar3 = analysisBinding[2].super.super.name;
        sVar4 = sysbvm_tuple_size_decode(analysisBinding[2].super.super.header.field_0.typePointer);
        sVar3 = sysbvm_array_at(sVar3,sVar4 + bindingType);
        return sVar3;
      }
      if (foundBinding == *(sysbvm_tuple_t *)(environment_local + 0x630)) {
        sVar3._0_4_ = analysisBinding[2].super.super.header.identityHashAndFlags;
        sVar3._4_4_ = analysisBinding[2].super.super.header.objectSize;
        sVar3 = sysbvm_array_at(sVar3,bindingType);
        return sVar3;
      }
      abort();
    }
  }
  local_50 = 0;
  sVar2 = sysbvm_symbolBinding_getName((sysbvm_tuple_t)activationEnvironment);
  _Var1 = sysbvm_environment_lookSymbolRecursively
                    ((sysbvm_context_t *)context_00,sVar3,sVar2,&local_50);
  if (!_Var1) {
    sysbvm_error("Failed to evaluate analyzed symbol binding.");
  }
  _Var1 = sysbvm_symbolBinding_isValueQuick((sysbvm_context_t *)environment_local,local_50);
  if (!_Var1) {
    sysbvm_error("A value binding in the evaluation context is required.");
  }
  sVar3 = sysbvm_symbolValueBinding_getValue(local_50);
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_evaluateSymbolBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(sysbvm_tuple_getType(context, environment) == context->roots.functionActivationEnvironmentType)
    {
        sysbvm_functionActivationEnvironment_t *activationEnvironment = (sysbvm_functionActivationEnvironment_t*)environment;
        sysbvm_symbolAnalysisBinding_t *analysisBinding = (sysbvm_symbolAnalysisBinding_t*)binding;
        if(analysisBinding->ownerFunction == activationEnvironment->functionDefinition || activationEnvironment->dependentFunctionType)
        {
            size_t vectorIndex = sysbvm_tuple_size_decode(analysisBinding->vectorIndex);
            sysbvm_tuple_t bindingType = sysbvm_tuple_getType(context, binding);
            if(bindingType == context->roots.symbolArgumentBindingType)
                return sysbvm_array_at(activationEnvironment->valueVector, vectorIndex);
            else if(bindingType == context->roots.symbolLocalBindingType)
                return sysbvm_array_at(activationEnvironment->valueVector, sysbvm_tuple_size_decode(activationEnvironment->argumentVectorSize) + vectorIndex);
            else if(bindingType == context->roots.symbolCaptureBindingType)
                return sysbvm_array_at(activationEnvironment->captureVector, vectorIndex);
            abort();
        }
    }

    sysbvm_tuple_t foundBinding = SYSBVM_NULL_TUPLE;
    if(!sysbvm_environment_lookSymbolRecursively(context, environment, sysbvm_symbolBinding_getName(binding), &foundBinding))
        sysbvm_error("Failed to evaluate analyzed symbol binding.");

    if(!sysbvm_symbolBinding_isValueQuick(context, foundBinding))
        sysbvm_error("A value binding in the evaluation context is required.");

    return sysbvm_symbolValueBinding_getValue(foundBinding);
}